

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void ** __thiscall kj::Vector<void*>::add<void*&>(Vector<void*> *this,void **params)

{
  void **ppvVar1;
  undefined8 *puVar2;
  
  puVar2 = *(undefined8 **)(this + 8);
  if (puVar2 == *(undefined8 **)(this + 0x10)) {
    Vector<void_*>::grow((Vector<void_*> *)this,0);
    puVar2 = *(undefined8 **)(this + 8);
  }
  *puVar2 = *params;
  ppvVar1 = *(void ***)(this + 8);
  *(void ***)(this + 8) = ppvVar1 + 1;
  return ppvVar1;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }